

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arithmetic.h
# Opt level: O0

Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_> *
gimage::operator/=(Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_> *image,double s)

{
  bool bVar1;
  store_t_conflict1 sVar2;
  int iVar3;
  long lVar4;
  Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_> *in_RDI;
  unsigned_short v;
  long i;
  long k;
  int d;
  work_t in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffbc;
  Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_> *this;
  long i_00;
  int iVar5;
  undefined2 in_stack_ffffffffffffffd4;
  Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_> *local_28;
  long local_20;
  int local_14;
  
  local_14 = 0;
  while (iVar5 = local_14,
        iVar3 = Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_>::getDepth(in_RDI),
        iVar5 < iVar3) {
    local_20 = 0;
    while (i_00 = local_20,
          lVar4 = Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_>::getHeight(in_RDI),
          i_00 < lVar4) {
      local_28 = (Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_> *)0x0;
      while (this = local_28,
            lVar4 = Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_>::getWidth(in_RDI),
            (long)this < lVar4) {
        sVar2 = Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_>::get
                          (in_RDI,(long)local_28,local_20,local_14);
        bVar1 = Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_>::isValidS
                          (this,(store_t_conflict1)((uint)in_stack_ffffffffffffffbc >> 0x10));
        if (bVar1) {
          Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_>::setLimited
                    ((Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_> *)
                     CONCAT26(sVar2,CONCAT24(in_stack_ffffffffffffffd4,iVar5)),i_00,(long)this,
                     in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8);
        }
        local_28 = (Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_> *)
                   ((long)&local_28->depth + 1);
      }
      local_20 = local_20 + 1;
    }
    local_14 = local_14 + 1;
  }
  return in_RDI;
}

Assistant:

Image<T> &operator/=(Image<T> &image, double s)
{
  for (int d=0; d<image.getDepth(); d++)
  {
    for (long k=0; k<image.getHeight(); k++)
    {
      for (long i=0; i<image.getWidth(); i++)
      {
        T v=0;

        v=image.get(i, k, d);

        if (image.isValidS(v))
        {
          image.setLimited(i, k, d, static_cast<typename Image<T>::work_t>(v/s));
        }
      }
    }
  }

  return image;
}